

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

bool rprog_unset(ROOM_INDEX_DATA *room,char *progtype,char *name)

{
  bool bVar1;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var2;
  int i;
  int local_24;
  bool local_1;
  
  local_24 = 0;
  while ((rprog_table[local_24].name != (char *)0x0 &&
         (bVar1 = str_cmp(rprog_table[local_24].name,in_RDX), bVar1))) {
    local_24 = local_24 + 1;
  }
  if (rprog_table[local_24].name == (char *)0x0) {
    local_1 = false;
  }
  else {
    bVar1 = str_cmp(in_RSI,"pulse_prog");
    if (bVar1) {
      bVar1 = str_cmp(in_RSI,"entry_prog");
      if (bVar1) {
        bVar1 = str_cmp(in_RSI,"move_prog");
        if (bVar1) {
          bVar1 = str_cmp(in_RSI,"drop_prog");
          if (bVar1) {
            bVar1 = str_cmp(in_RSI,"speech_prog");
            if (bVar1) {
              bVar1 = str_cmp(in_RSI,"open_prog");
              if (!bVar1) {
                *(undefined8 *)(*(long *)(in_RDI + 0x178) + 0x28) = 0;
                free_pstring(in_RDX);
                _Var2 = std::pow<int,int>(0,0x6be978);
                *(ulong *)(in_RDI + 0x180) =
                     ((long)_Var2 ^ 0xffffffffffffffffU) & *(ulong *)(in_RDI + 0x180);
              }
            }
            else {
              *(undefined8 *)(*(long *)(in_RDI + 0x178) + 0x20) = 0;
              free_pstring(in_RDX);
              _Var2 = std::pow<int,int>(0,0x6be90d);
              *(ulong *)(in_RDI + 0x180) =
                   ((long)_Var2 ^ 0xffffffffffffffffU) & *(ulong *)(in_RDI + 0x180);
            }
          }
          else {
            *(undefined8 *)(*(long *)(in_RDI + 0x178) + 0x18) = 0;
            free_pstring(in_RDX);
            _Var2 = std::pow<int,int>(0,0x6be89f);
            *(ulong *)(in_RDI + 0x180) =
                 ((long)_Var2 ^ 0xffffffffffffffffU) & *(ulong *)(in_RDI + 0x180);
          }
        }
        else {
          *(undefined8 *)(*(long *)(in_RDI + 0x178) + 0x10) = 0;
          free_pstring(in_RDX);
          _Var2 = std::pow<int,int>(0,0x6be831);
          *(ulong *)(in_RDI + 0x180) =
               ((long)_Var2 ^ 0xffffffffffffffffU) & *(ulong *)(in_RDI + 0x180);
        }
      }
      else {
        *(undefined8 *)(*(long *)(in_RDI + 0x178) + 8) = 0;
        free_pstring(in_RDX);
        _Var2 = std::pow<int,int>(0,0x6be7c6);
        *(ulong *)(in_RDI + 0x180) =
             ((long)_Var2 ^ 0xffffffffffffffffU) & *(ulong *)(in_RDI + 0x180);
      }
    }
    else {
      **(undefined8 **)(in_RDI + 0x178) = 0;
      free_pstring(in_RDX);
      _Var2 = std::pow<int,int>(0,0x6be758);
      *(ulong *)(in_RDI + 0x180) = ((long)_Var2 ^ 0xffffffffffffffffU) & *(ulong *)(in_RDI + 0x180);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool rprog_unset(ROOM_INDEX_DATA *room, const char *progtype, const char *name)
{
	int i;
	for (i = 0; rprog_table[i].name; i++)
	{
		if (!str_cmp(rprog_table[i].name, name))
			break;
	}

	if (!rprog_table[i].name)
		return false;

	// IF YOU ADD A NEW TYPE ALSO PUT IT IN DB.C DO_ADUMP
	if (!str_cmp(progtype, "pulse_prog"))
	{
		room->rprogs->pulse_prog = nullptr;
		free_pstring(room->rprogs->pulse_name);
		REMOVE_BIT(room->progtypes, RPROG_PULSE);
	}
	else if (!str_cmp(progtype, "entry_prog"))
	{
		room->rprogs->entry_prog = nullptr;
		free_pstring(room->rprogs->entry_name);
		REMOVE_BIT(room->progtypes, RPROG_ENTRY);
	}
	else if (!str_cmp(progtype, "move_prog"))
	{
		room->rprogs->move_prog = nullptr;
		free_pstring(room->rprogs->move_name);
		REMOVE_BIT(room->progtypes, RPROG_MOVE);
	}
	else if (!str_cmp(progtype, "drop_prog"))
	{
		room->rprogs->drop_prog = nullptr;
		free_pstring(room->rprogs->drop_name);
		REMOVE_BIT(room->progtypes, RPROG_DROP);
	}
	else if (!str_cmp(progtype, "speech_prog"))
	{
		room->rprogs->speech_prog = nullptr;
		free_pstring(room->rprogs->speech_name);
		REMOVE_BIT(room->progtypes, RPROG_SPEECH);
	}
	else if (!str_cmp(progtype, "open_prog"))
	{
		room->rprogs->open_prog = nullptr;
		free_pstring(room->rprogs->open_name);
		REMOVE_BIT(room->progtypes, RPROG_OPEN);
	}

	return true;
}